

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Insert_Leaf(BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *C,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,Addr p)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  reference pvVar5;
  bool bVar6;
  bool local_ba;
  int local_a0;
  int local_9c;
  int j;
  int i;
  int pos;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *C_local;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  Addr p_local;
  
  local_28 = k;
  k_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)C;
  C_local = (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this;
  this_local = (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)p;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_88,C);
  LockNode(this,&local_88);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_88);
  local_9c = 0;
  while( true ) {
    bVar6 = false;
    if (local_9c < this->N) {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(k_local + 0x20),(long)local_9c);
      bVar6 = *pvVar2 == '1';
    }
    if (!bVar6) break;
    local_9c = local_9c + 1;
  }
  j = 0;
  while( true ) {
    local_ba = false;
    if (j < this->N) {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(k_local + 0x20),(long)j);
      local_ba = false;
      if (*pvVar2 == '1') {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(k_local + 8),(long)j);
        local_ba = std::operator<(pvVar3,k);
      }
    }
    if (local_ba == false) break;
    j = j + 1;
  }
  for (local_a0 = local_9c; j < local_a0; local_a0 = local_a0 + -1) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(k_local + 0x20),
                        (long)(local_a0 + -1));
    vVar1 = *pvVar2;
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(k_local + 0x20),(long)local_a0);
    *pvVar2 = vVar1;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(k_local + 8),(long)(local_a0 + -1));
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(k_local + 8),(long)local_a0);
    std::__cxx11::string::operator=((string *)this_00,(string *)pvVar3);
    pvVar4 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)(k_local + 0x38),
                        (long)(local_a0 + -1));
    pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)(k_local + 0x38),(long)local_a0);
    *pvVar5 = *pvVar4;
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(k_local + 8),(long)j);
  std::__cxx11::string::operator=((string *)pvVar3,(string *)k);
  pvVar4 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                     ((vector<Addr,_std::allocator<Addr>_> *)(k_local + 0x38),(long)j);
  *pvVar4 = (value_type)this_local;
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)(k_local + 0x20),(long)j);
  *pvVar2 = '1';
  return;
}

Assistant:

void BpTree<K>::Insert_Leaf(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	//�õ���Ӧ��ַ�����ã���C�޸ļ��ɶ�ԭ���޸�
	int pos, i, j;
	for (i = 0; i < N && C.v[i] == '1'; i++);							//��iλ���п�
	for (pos = 0; pos < N && C.v[pos] == '1' && C.k[pos] < k; pos++);	//pos���Ժ���Ҫ��Ǩ
	for (j = i; j > pos; j--) {
		C.v[j] = C.v[j - 1];
		C.k[j] = C.k[j - 1];
		C.p[j] = C.p[j - 1];
	}
	C.k[pos] = k;
	C.p[pos] = p;
	C.v[pos] = '1';
}